

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

void __thiscall
google::protobuf::StringPiece::StringPiece
          (StringPiece *this,StringPiece x,stringpiece_ssize_type pos)

{
  LogMessage *pLVar1;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  stringpiece_ssize_type local_28;
  stringpiece_ssize_type pos_local;
  StringPiece *this_local;
  StringPiece x_local;
  
  x_local.ptr_ = (char *)x.length_;
  this_local = (StringPiece *)x.ptr_;
  this->ptr_ = (char *)((long)&this_local->ptr_ + pos);
  this->length_ = (long)x_local.ptr_ - pos;
  local_61 = 0;
  local_28 = pos;
  pos_local = (stringpiece_ssize_type)this;
  if (pos < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x34);
    local_61 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (0) <= (pos): ");
    internal::LogFinisher::operator=(local_75,pLVar1);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  local_b1 = 0;
  if ((long)x_local.ptr_ < local_28) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x35);
    local_b1 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_b0,"CHECK failed: (pos) <= (x.length_): ");
    internal::LogFinisher::operator=(&local_b2,pLVar1);
  }
  if ((local_b1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b0);
  }
  return;
}

Assistant:

StringPiece::StringPiece(StringPiece x, stringpiece_ssize_type pos)
    : ptr_(x.ptr_ + pos), length_(x.length_ - pos) {
  GOOGLE_DCHECK_LE(0, pos);
  GOOGLE_DCHECK_LE(pos, x.length_);
}